

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterutils.cpp
# Opt level: O2

Error asmjit::v1_14::EmitterUtils::logInstructionFailed
                (BaseEmitter *self,Error err,InstId instId,InstOptions options,Operand_ *o0,
                Operand_ *o1,Operand_ *o2,Operand_ *opExt)

{
  Error EVar1;
  char *pcVar2;
  InstId local_1d8;
  InstOptions local_1d4;
  RegOnly local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  char *local_1b0;
  char local_1a8 [272];
  Operand_ opArray [6];
  
  local_1b0 = local_1a8;
  uStack_1c0 = 0;
  local_1c8 = 0x20;
  local_1b8 = 0x107;
  local_1a8[0] = '\0';
  pcVar2 = DebugUtils::errorAsString(err);
  String::_opString((String *)&local_1c8,kAppend,pcVar2,0xffffffffffffffff);
  String::_opString((String *)&local_1c8,kAppend,": ",0xffffffffffffffff);
  opArrayFromEmitArgs(opArray,o0,o1,o2,opExt);
  local_1d0 = self->_extraReg;
  local_1d8 = instId;
  local_1d4 = options;
  (*(self->_funcs).formatInstruction)
            ((String *)&local_1c8,kRegType,self,(self->_environment)._arch,(BaseInst *)&local_1d8,
             opArray,6);
  if (self->_inlineComment != (char *)0x0) {
    String::_opString((String *)&local_1c8,kAppend," ; ",0xffffffffffffffff);
    String::_opString((String *)&local_1c8,kAppend,self->_inlineComment,0xffffffffffffffff);
  }
  *(undefined4 *)((long)&self->_inlineComment + 4) = 0;
  self->_instOptions = kNone;
  (self->_extraReg)._signature = 0;
  *(undefined8 *)&(self->_extraReg)._id = 0;
  pcVar2 = local_1b0;
  if ((byte)local_1c8._0_1_ < 0x1f) {
    pcVar2 = (char *)((long)&local_1c8 + 1);
  }
  EVar1 = BaseEmitter::reportError(self,err,pcVar2);
  String::reset((String *)&local_1c8);
  return EVar1;
}

Assistant:

Error logInstructionFailed(
  BaseEmitter* self,
  Error err,
  InstId instId,
  InstOptions options,
  const Operand_& o0, const Operand_& o1, const Operand_& o2, const Operand_* opExt) {

  StringTmp<256> sb;
  sb.append(DebugUtils::errorAsString(err));
  sb.append(": ");

  Operand_ opArray[Globals::kMaxOpCount];
  opArrayFromEmitArgs(opArray, o0, o1, o2, opExt);

  self->_funcs.formatInstruction(sb, FormatFlags::kRegType, self, self->arch(), BaseInst(instId, options, self->extraReg()), opArray, Globals::kMaxOpCount);

  if (self->inlineComment()) {
    sb.append(" ; ");
    sb.append(self->inlineComment());
  }

  self->resetState();
  return self->reportError(err, sb.data());
}